

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GetEnumValUse_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,EnumVal *enum_val)

{
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  EnumVal *local_28;
  EnumVal *enum_val_local;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  local_28 = enum_val;
  enum_val_local = (EnumVal *)enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  if (((this->opts_).super_IDLOptions.scoped_enums & 1U) == 0) {
    if (((this->opts_).super_IDLOptions.prefixed_enums & 1U) == 0) {
      Name_abi_cxx11_(__return_storage_ptr__,this,enum_val);
    }
    else {
      Name_abi_cxx11_(&local_d8,this,&enum_def->super_Definition);
      std::operator+(&local_b8,&local_d8,"_");
      Name_abi_cxx11_(&local_f8,this,local_28);
      std::operator+(__return_storage_ptr__,&local_b8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
  }
  else {
    Name_abi_cxx11_(&local_68,this,&enum_def->super_Definition);
    std::operator+(&local_48,&local_68,"::");
    Name_abi_cxx11_(&local_98,this,local_28);
    std::operator+(__return_storage_ptr__,&local_48,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumValUse(const EnumDef &enum_def,
                            const EnumVal &enum_val) const {
    if (opts_.scoped_enums) {
      return Name(enum_def) + "::" + Name(enum_val);
    } else if (opts_.prefixed_enums) {
      return Name(enum_def) + "_" + Name(enum_val);
    } else {
      return Name(enum_val);
    }
  }